

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.h
# Opt level: O2

void __thiscall
pstack::Procman::MappedObject::MappedObject(MappedObject *this,string_view name,sptr *objptr)

{
  undefined1 local_30 [8];
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  local_30 = (undefined1  [8])name._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)local_30,
             (allocator<char> *)((long)&name_local._M_str + 7));
  std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->objptr_).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>,
             &objptr->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

MappedObject(std::string_view name, const Elf::Object::sptr &objptr = {})
        : name_{name}, objptr_{objptr} {}